

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_cleanup(CookieInfo *c)

{
  Cookie *pCVar1;
  Cookie *co;
  
  if (c == (CookieInfo *)0x0) {
    return;
  }
  (*Curl_cfree)(c->filename);
  co = c->cookies;
  while (co != (Cookie *)0x0) {
    pCVar1 = co->next;
    freecookie(co);
    co = pCVar1;
  }
  (*Curl_cfree)(c);
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  if(c) {
    free(c->filename);
    Curl_cookie_freelist(c->cookies);
    free(c); /* free the base struct as well */
  }
}